

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LessEqualLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_lessequal(NeuralNetworkLayer *this)

{
  bool bVar1;
  LessEqualLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_lessequal(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_lessequal(this);
    this_00 = (LessEqualLayerParams *)operator_new(0x18);
    LessEqualLayerParams::LessEqualLayerParams(this_00);
    (this->layer_).lessequal_ = this_00;
  }
  return (LessEqualLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LessEqualLayerParams* NeuralNetworkLayer::mutable_lessequal() {
  if (!has_lessequal()) {
    clear_layer();
    set_has_lessequal();
    layer_.lessequal_ = new ::CoreML::Specification::LessEqualLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.lessEqual)
  return layer_.lessequal_;
}